

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection_segment.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnDataCollectionSegment::ColumnDataCollectionSegment
          (ColumnDataCollectionSegment *this,
          shared_ptr<duckdb::ColumnDataAllocator,_true> *allocator_p,
          vector<duckdb::LogicalType,_true> *types_p)

{
  long in_RDI;
  Allocator *args;
  ColumnDataAllocator *in_stack_ffffffffffffff88;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff90;
  
  shared_ptr<duckdb::ColumnDataAllocator,_true>::shared_ptr
            ((shared_ptr<duckdb::ColumnDataAllocator,_true> *)in_stack_ffffffffffffff90,
             (shared_ptr<duckdb::ColumnDataAllocator,_true> *)in_stack_ffffffffffffff88);
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_ffffffffffffff90,
             (vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff88);
  *(undefined8 *)(in_RDI + 0x28) = 0;
  vector<duckdb::ChunkMetaData,_true>::vector((vector<duckdb::ChunkMetaData,_true> *)0x37e95a);
  vector<duckdb::VectorMetaData,_true>::vector((vector<duckdb::VectorMetaData,_true> *)0x37e96d);
  args = (Allocator *)(in_RDI + 0x60);
  vector<duckdb::VectorDataIndex,_true>::vector((vector<duckdb::VectorDataIndex,_true> *)0x37e980);
  shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->
            ((shared_ptr<duckdb::ColumnDataAllocator,_true> *)in_stack_ffffffffffffff90);
  ColumnDataAllocator::GetAllocator(in_stack_ffffffffffffff88);
  make_shared_ptr<duckdb::StringHeap,duckdb::Allocator&>(args);
  return;
}

Assistant:

ColumnDataCollectionSegment::ColumnDataCollectionSegment(shared_ptr<ColumnDataAllocator> allocator_p,
                                                         vector<LogicalType> types_p)
    : allocator(std::move(allocator_p)), types(std::move(types_p)), count(0),
      heap(make_shared_ptr<StringHeap>(allocator->GetAllocator())) {
}